

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_block_instructions(CompilerGLSL *this,SPIRBlock *block)

{
  Instruction *op;
  Instruction *pIVar1;
  long lVar2;
  
  this->current_emitting_block = block;
  pIVar1 = (block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
  for (lVar2 = (block->ops).super_VectorView<spirv_cross::Instruction>.buffer_size * 0xc; lVar2 != 0
      ; lVar2 = lVar2 + -0xc) {
    (*(this->super_Compiler)._vptr_Compiler[8])(this,pIVar1);
    pIVar1 = pIVar1 + 1;
  }
  this->current_emitting_block = (SPIRBlock *)0x0;
  return;
}

Assistant:

void CompilerGLSL::emit_block_instructions(SPIRBlock &block)
{
	current_emitting_block = &block;
	for (auto &op : block.ops)
		emit_instruction(op);
	current_emitting_block = nullptr;
}